

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

ClientRequests * __thiscall
cmFileAPI::BuildClientRequests
          (ClientRequests *__return_storage_ptr__,cmFileAPI *this,Value *requests)

{
  bool bVar1;
  ArrayIndex AVar2;
  const_iterator cVar3;
  ClientRequest local_b8;
  reference local_88;
  Value *request;
  undefined1 local_78;
  undefined1 local_70 [8];
  const_iterator __end1;
  undefined1 local_50 [8];
  const_iterator __begin1;
  Value *__range1;
  Value *requests_local;
  cmFileAPI *this_local;
  ClientRequests *result;
  
  ClientRequests::ClientRequests(__return_storage_ptr__);
  bVar1 = Json::Value::isNull(requests);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Error,"\'requests\' member missing");
  }
  else {
    bVar1 = Json::Value::isArray(requests);
    if (bVar1) {
      AVar2 = Json::Value::size(requests);
      std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::reserve
                (&__return_storage_ptr__->
                  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>,
                 (ulong)AVar2);
      __begin1.super_ValueIteratorBase._8_8_ = requests;
      cVar3 = Json::Value::begin(requests);
      __end1.super_ValueIteratorBase._8_8_ = cVar3.super_ValueIteratorBase.current_._M_node;
      __begin1.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar3.super_ValueIteratorBase.isNull_;
      local_50 = (undefined1  [8])__end1.super_ValueIteratorBase._8_8_;
      cVar3 = Json::Value::end((Value *)__begin1.super_ValueIteratorBase._8_8_);
      request = (Value *)cVar3.super_ValueIteratorBase.current_._M_node;
      local_78 = cVar3.super_ValueIteratorBase.isNull_;
      local_70 = (undefined1  [8])request;
      __end1.super_ValueIteratorBase.current_._M_node._0_1_ = local_78;
      while (bVar1 = Json::ValueIteratorBase::operator!=
                               ((ValueIteratorBase *)local_50,(SelfType *)local_70), bVar1) {
        local_88 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_50);
        BuildClientRequest(&local_b8,this,local_88);
        std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::
        emplace_back<cmFileAPI::ClientRequest>
                  (&__return_storage_ptr__->
                    super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                   ,&local_b8);
        ClientRequest::~ClientRequest(&local_b8);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_50);
      }
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->Error,"\'requests\' member is not an array");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequests cmFileAPI::BuildClientRequests(
  Json::Value const& requests)
{
  ClientRequests result;
  if (requests.isNull()) {
    result.Error = "'requests' member missing";
    return result;
  }
  if (!requests.isArray()) {
    result.Error = "'requests' member is not an array";
    return result;
  }

  result.reserve(requests.size());
  for (Json::Value const& request : requests) {
    result.emplace_back(this->BuildClientRequest(request));
  }

  return result;
}